

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

string * fsbridge::get_filesystem_error_message(string *__return_storage_ptr__,filesystem_error *e)

{
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string get_filesystem_error_message(const fs::filesystem_error& e)
{
#ifndef WIN32
    return e.what();
#else
    // Convert from Multi Byte to utf-16
    std::string mb_string(e.what());
    int size = MultiByteToWideChar(CP_ACP, 0, mb_string.data(), mb_string.size(), nullptr, 0);

    std::wstring utf16_string(size, L'\0');
    MultiByteToWideChar(CP_ACP, 0, mb_string.data(), mb_string.size(), &*utf16_string.begin(), size);
    // Convert from utf-16 to utf-8
    return std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>, wchar_t>().to_bytes(utf16_string);
#endif
}